

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::GeneratePropertyDeclaration
          (SingleFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  int iVar1;
  
  variables = &(this->super_FieldGenerator).variables_;
  io::Printer::Print(printer,variables,"$comments$");
  io::Printer::Print(printer,variables,
                     "@property(nonatomic, readwrite) $property_type$ $name$$deprecated_attribute$;\n\n"
                    );
  iVar1 = (*(this->super_FieldGenerator)._vptr_FieldGenerator[0xc])(this);
  if ((char)iVar1 != '\0') {
    io::Printer::Print(printer,variables,
                       "@property(nonatomic, readwrite) BOOL has$capitalized_name$$deprecated_attribute$;\n"
                      );
    return;
  }
  return;
}

Assistant:

void SingleFieldGenerator::GeneratePropertyDeclaration(
    io::Printer* printer) const {
  printer->Print(variables_, "$comments$");
  printer->Print(
      variables_,
      "@property(nonatomic, readwrite) $property_type$ $name$$deprecated_attribute$;\n"
      "\n");
  if (WantsHasProperty()) {
    printer->Print(
        variables_,
        "@property(nonatomic, readwrite) BOOL has$capitalized_name$$deprecated_attribute$;\n");
  }
}